

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

QPoint __thiscall QVariant::toPoint(QVariant *this)

{
  ulong uVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QMetaType local_28;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QPoint>::metaType;
  local_20 = (QPoint)(*(ulong *)&(this->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual((QMetaType *)&local_20,&local_28);
  if (bVar3) {
    if (((this->d).field_0x18 & 1) != 0) {
      pPVar2 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar2->offset);
    }
  }
  else {
    local_20.xp.m_i = 0;
    local_20.yp.m_i = 0;
    uVar1 = *(ulong *)&(this->d).field_0x18;
    if ((uVar1 & 1) != 0) {
      pPVar2 = (this->d).data.shared;
      this = (QVariant *)
             ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
                     .super___atomic_base<int> + (long)pPVar2->offset);
    }
    QMetaType::convert((QMetaTypeInterface *)(uVar1 & 0xfffffffffffffffc),this,local_28,&local_20);
    this = (QVariant *)&local_20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return *(QPoint *)this;
}

Assistant:

QPoint QVariant::toPoint() const
{
    return qvariant_cast<QPoint>(*this);
}